

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

string * __thiscall
FIX::Dictionary::getString
          (string *__return_storage_ptr__,Dictionary *this,string *key,bool capitalize)

{
  bool bVar1;
  ConfigError *this_00;
  pointer ppVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Self local_68 [3];
  string local_50;
  _Self local_30;
  const_iterator i;
  bool capitalize_local;
  string *key_local;
  Dictionary *this_local;
  string *result;
  
  i._M_node._7_1_ = capitalize;
  string_toUpper(&local_50,key);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_data,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_data);
  bVar1 = std::operator==(&local_30,local_68);
  if (bVar1) {
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_88,key," not defined");
    ConfigError::ConfigError(this_00,&local_88);
    __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  if ((i._M_node._7_1_ & 1) != 0) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,__last,__result,toupper);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Dictionary::getString( const std::string& key, bool capitalize ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  Data::const_iterator i = m_data.find(string_toUpper(key));
  if ( i == m_data.end() ) throw ConfigError( key + " not defined" );

  std::string result = i->second;
  if( capitalize )
     std::transform(result.begin(), result.end(), result.begin(), toupper);

  return result;
}